

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void DeviceAmstradCPC464(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *device;
  char *pcVar1;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  device = (CDevice *)operator_new(0x2838);
  device->Next = (CDevice *)0x0;
  device->SlotsCount = 0;
  device->PagesCount = 0;
  device->Memory = (byte *)0x0;
  device->ZxRamTop = 0;
  device->CurrentSlot = 0;
  device->previousSlotI = 0;
  device->previousSlotOpt = O_NONE;
  device->limitExceeded = false;
  pcVar1 = strdup("AMSTRADCPC464");
  device->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = device;
  }
  memset(device->Slots,0,0x2800);
  *dev = device;
  initRegularSlotDevice(device,0x4000,4,4,(int *)&DAT_00160630);
  return;
}

Assistant:

static void DeviceAmstradCPC464(CDevice** dev, CDevice* parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice("AMSTRADCPC464", parent);
	const int initialPages[] = { 0, 1, 2, 3 };
	initRegularSlotDevice(*dev, 0x4000, 4, 4, initialPages);
}